

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::create_alpha_selector_codebook(dxt_hc *this)

{
  vector<unsigned_long_long> *this_00;
  elemental_vector *this_01;
  task_pool *this_02;
  undefined1 auVar1 [16];
  undefined1 auVar2 [8];
  dxt_hc *pdVar3;
  bool bVar4;
  int iVar5;
  executable_task *pObj;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  void *pvVar17;
  uint uVar18;
  uint uVar19;
  float *pfVar20;
  ulong uVar21;
  uint8 p;
  long lVar22;
  uint uVar23;
  long lVar24;
  undefined1 uVar25;
  long lVar26;
  void *pvVar27;
  uint t;
  uint64 uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  vector<crnlib::vector<crnlib::alpha_selector_details>_> selector_details;
  vector<crnlib::SelectorNode> nodes;
  vector<unsigned_int> weights;
  vector<crnlib::vec<16U,_float>_> vectors;
  vector<unsigned_long_long> selectors;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  float v [8];
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  undefined1 local_198 [8];
  uint64 *puStack_190;
  dxt_hc *local_188;
  uint local_17c;
  elemental_vector local_178;
  vector<unsigned_int> local_168;
  vector<crnlib::vec<16U,_float>_> local_158;
  elemental_vector local_148;
  ulong local_130;
  vector<unsigned_long_long> *local_128;
  vector<bool> *local_120;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  tree_clusterizer<crnlib::vec<16U,_float>_> local_d8;
  
  uVar12 = this->m_pTask_pool->m_num_threads;
  uVar18 = this->m_num_alpha_blocks;
  uVar16 = (this->m_num_blocks >> (this->m_has_subblocks & 0x1fU)) * uVar18;
  local_148.m_p = (void *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  if (uVar16 != 0) {
    elemental_vector::increase_capacity(&local_148,uVar16,uVar16 == 1,8,(object_mover)0x0,false);
    memset((void *)((local_148._8_8_ & 0xffffffff) * 8 + (long)local_148.m_p),0,
           (ulong)(uVar16 - local_148.m_size) << 3);
    local_148.m_size = uVar16;
    uVar18 = this->m_num_alpha_blocks;
  }
  local_17c = uVar12 + 1;
  if (uVar18 - 1 < 0xfffffffe) {
    uVar19 = this->m_num_blocks;
    uVar8 = 0;
    uVar11 = 1;
    do {
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        bVar4 = this->m_has_subblocks;
        uVar14 = 0;
        do {
          uVar6 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          *(unsigned_long_long *)((long)local_148.m_p + uVar6 * 8) =
               this->m_block_selectors[uVar11].m_p[uVar14];
          uVar23 = (int)uVar14 + bVar4 + 1;
          uVar14 = (ulong)uVar23;
          uVar19 = this->m_num_blocks;
        } while (uVar23 < uVar19);
        uVar18 = this->m_num_alpha_blocks;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar18 + 1);
  }
  local_178.m_p = (void *)0x0;
  local_178.m_size = 0;
  local_178.m_capacity = 0;
  local_188 = this;
  local_128 = (vector<unsigned_long_long> *)(ulong)uVar12;
  if (local_17c != 0) {
    uVar19 = 0;
    iVar9 = 1;
    pvVar17 = local_148.m_p;
    do {
      pvVar27 = (void *)(((ulong)(local_148.m_size * iVar9) / (ulong)local_17c) * 8 +
                        (long)local_148.m_p);
      if (pvVar17 != pvVar27) {
        if (local_178.m_capacity <= uVar19) {
          elemental_vector::increase_capacity
                    (&local_178,uVar19 + 1,true,0x10,vector<crnlib::SelectorNode>::object_mover,
                     false);
          uVar19 = local_178.m_size;
        }
        *(void **)((long)local_178.m_p + (ulong)uVar19 * 0x10) = pvVar17;
        *(void **)((long)local_178.m_p + (ulong)uVar19 * 0x10 + 8) = pvVar27;
        uVar19 = local_178.m_size + 1;
        local_178.m_size = uVar19;
      }
      iVar5 = iVar9 - uVar12;
      iVar9 = iVar9 + 1;
      pvVar17 = pvVar27;
    } while (iVar5 != 1);
    if (uVar19 != 0) {
      lVar13 = 0;
      uVar28 = 0;
      do {
        task_pool::queue_task
                  (local_188->m_pTask_pool,SelectorNode::sort_task,uVar28,
                   (void *)((long)local_178.m_p + lVar13));
        uVar28 = uVar28 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar28 < (local_178._8_8_ & 0xffffffff));
    }
  }
  task_pool::join(local_188->m_pTask_pool);
  local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_178.m_size != 0) {
    lVar13 = 0;
    uVar11 = 0;
    do {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push(&local_118,(value_type *)((long)local_178.m_p + lVar13));
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar11 < (local_178._8_8_ & 0xffffffff));
  }
  local_f8 = 0x3e4000003d800000;
  uStack_f0 = 0x3ee000003ea00000;
  local_e8 = 0x3f3000003f100000;
  uStack_e0 = 0x3f7000003f500000;
  local_158.m_p = (vec<16U,_float> *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  local_168.m_p = (uint *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  vector<crnlib::vec<16U,_float>_>::reserve(&local_158,local_148.m_size);
  vector<unsigned_int>::reserve(&local_168,local_148.m_size);
  if (local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      puStack_190 = (local_118.c.
                     super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pEnd;
      local_198 = (undefined1  [8])
                  ((local_118.c.
                    super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                    _M_impl.super__Vector_impl_data._M_start)->p + 1);
      uVar14 = *(local_118.c.
                 super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                 _M_impl.super__Vector_impl_data._M_start)->p;
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::pop(&local_118);
      if (local_198 != (undefined1  [8])puStack_190) {
        std::
        priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
        ::push(&local_118,(value_type *)local_198);
      }
      uVar12 = (uint)uVar14 & 0xffff;
      uVar14 = uVar14 >> 0x10;
      if (local_158.m_size == 0 || uVar14 != uVar11) {
        lVar13 = 0xf;
        uVar11 = uVar14;
        do {
          *(undefined4 *)((long)&local_d8.m_vectors + lVar13 * 4) =
               *(undefined4 *)((long)&local_f8 + (ulong)((uint)uVar11 & 7) * 4);
          uVar11 = uVar11 >> 3;
          bVar4 = lVar13 != 0;
          lVar13 = lVar13 + -1;
        } while (bVar4);
        if (local_158.m_capacity <= local_158.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_158,local_158.m_size + 1,true,0x40,(object_mover)0x0
                     ,false);
        }
        pfVar20 = local_158.m_p[local_158.m_size].m_s + 0xc;
        pfVar20[0] = (float)local_d8.m_vectorsInfo.m_size;
        pfVar20[1] = (float)local_d8.m_vectorsInfo.m_capacity;
        *(VectorInfo **)(pfVar20 + 2) = local_d8.m_vectorsInfoLeft.m_p;
        pfVar20 = local_158.m_p[local_158.m_size].m_s + 8;
        pfVar20[0] = (float)local_d8.m_weightedDotProducts.m_size;
        pfVar20[1] = (float)local_d8.m_weightedDotProducts.m_capacity;
        *(VectorInfo **)(pfVar20 + 2) = local_d8.m_vectorsInfo.m_p;
        pfVar20 = local_158.m_p[local_158.m_size].m_s + 4;
        pfVar20[0] = (float)local_d8.m_weightedVectors.m_size;
        pfVar20[1] = (float)local_d8.m_weightedVectors.m_capacity;
        *(double **)(pfVar20 + 2) = local_d8.m_weightedDotProducts.m_p;
        *(vec<16U,_float> **)local_158.m_p[local_158.m_size].m_s = local_d8.m_vectors;
        *(vec<16U,_float> **)(local_158.m_p[local_158.m_size].m_s + 2) =
             local_d8.m_weightedVectors.m_p;
        local_158.m_size = local_158.m_size + 1;
        if (local_168.m_capacity <= local_168.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_168,local_168.m_size + 1,true,4,(object_mover)0x0,
                     false);
        }
        local_168.m_p[local_168.m_size] = uVar12;
        local_168.m_size = local_168.m_size + 1;
        uVar11 = uVar14;
      }
      else {
        uVar19 = local_168.m_size - 1;
        if (CARRY4(uVar12,local_168.m_p[uVar19])) {
          local_168.m_p[uVar19] = 0xffffffff;
        }
        else {
          local_168.m_p[uVar19] = uVar12 + local_168.m_p[uVar19];
        }
      }
    } while (local_118.c.
             super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl
             .super__Vector_impl_data._M_finish !=
             local_118.c.
             super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl
             .super__Vector_impl_data._M_start);
  }
  pdVar3 = local_188;
  local_d8.m_node_index_map.m_values.m_p = (raw_node *)0x0;
  local_d8.m_node_index_map.m_values.m_size = 0;
  local_d8.m_node_index_map.m_values.m_capacity = 0;
  local_d8.m_vectorComparison.m_p = (bool *)0x0;
  local_d8.m_vectorComparison.m_size = 0;
  local_d8.m_vectorComparison.m_capacity = 0;
  local_d8.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoRight.m_size = 0;
  local_d8.m_vectorsInfoRight.m_capacity = 0;
  local_d8.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoLeft.m_size = 0;
  local_d8.m_vectorsInfoLeft.m_capacity = 0;
  local_d8.m_vectorsInfo.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfo.m_size = 0;
  local_d8.m_vectorsInfo.m_capacity = 0;
  local_d8.m_weightedDotProducts.m_p = (double *)0x0;
  local_d8.m_weightedDotProducts.m_size = 0;
  local_d8.m_weightedDotProducts.m_capacity = 0;
  local_d8.m_weightedVectors.m_p = (vec<16U,_float> *)0x0;
  local_d8.m_weightedVectors.m_size = 0;
  local_d8.m_weightedVectors.m_capacity = 0;
  local_d8.m_node_index_map.m_hash_shift = 0x20;
  local_d8.m_node_index_map.m_num_valid = 0;
  local_d8.m_node_index_map.m_grow_threshold = 0;
  local_d8.m_nodes.m_p = (vq_node *)0x0;
  local_d8.m_nodes.m_size = 0;
  local_d8.m_nodes.m_capacity = 0;
  local_d8.m_codebook.m_p = (vec<16U,_float> *)0x0;
  local_d8.m_codebook.m_size = 0;
  local_d8.m_codebook.m_capacity = 0;
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            (&local_d8,local_158.m_p,local_168.m_p,local_158.m_size,
             (local_188->m_params).m_alpha_selector_codebook_size,false,local_188->m_pTask_pool);
  uVar19 = local_17c;
  this_00 = &pdVar3->m_alpha_selectors;
  uVar18 = local_d8.m_codebook.m_size;
  uVar12 = (pdVar3->m_alpha_selectors).m_size;
  uVar16 = local_d8.m_codebook.m_size;
  if (uVar12 != local_d8.m_codebook.m_size) {
    if (uVar12 <= local_d8.m_codebook.m_size) {
      if ((pdVar3->m_alpha_selectors).m_capacity < local_d8.m_codebook.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,local_d8.m_codebook.m_size,
                   uVar12 + 1 == local_d8.m_codebook.m_size,8,(object_mover)0x0,false);
        uVar12 = (pdVar3->m_alpha_selectors).m_size;
      }
      memset(this_00->m_p + uVar12,0,(ulong)(uVar18 - uVar12) << 3);
      uVar16 = local_d8.m_codebook.m_size;
    }
    (pdVar3->m_alpha_selectors).m_size = uVar18;
  }
  local_120 = &pdVar3->m_alpha_selectors_used;
  uVar12 = (pdVar3->m_alpha_selectors_used).m_size;
  uVar8 = uVar16;
  if (uVar12 != uVar16) {
    if (uVar12 <= uVar16) {
      if ((pdVar3->m_alpha_selectors_used).m_capacity < uVar16) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_120,uVar16,uVar12 + 1 == uVar16,1,(object_mover)0x0,
                   false);
        uVar12 = (pdVar3->m_alpha_selectors_used).m_size;
      }
      memset(local_120->m_p + uVar12,0,(ulong)(uVar16 - uVar12));
      uVar8 = local_d8.m_codebook.m_size;
    }
    (pdVar3->m_alpha_selectors_used).m_size = uVar16;
  }
  if (uVar8 != 0) {
    lVar13 = 0;
    uVar11 = 0;
    do {
      pfVar20 = (float *)((long)(local_d8.m_codebook.m_p)->m_s + lVar13);
      this_00->m_p[uVar11] = 0;
      lVar10 = 0;
      do {
        uVar14 = (ulong)(*pfVar20 * 8.0);
        this_00->m_p[uVar11] =
             this_00->m_p[uVar11] |
             ((long)(*pfVar20 * 8.0 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14) <<
             ((byte)lVar10 & 0x3f);
        lVar10 = lVar10 + 3;
        pfVar20 = pfVar20 + 1;
      } while (lVar10 != 0x30);
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x40;
    } while (uVar11 < (local_d8.m_codebook._8_8_ & 0xffffffff));
  }
  local_198 = (undefined1  [8])0x0;
  puStack_190 = (uint64 *)0x0;
  local_130 = (ulong)uVar19;
  if (uVar19 != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)local_198,uVar19,(int)local_128 == 0,0x10,(object_mover)0x0,false
              );
    if (uVar19 != (uint)puStack_190) {
      memset((uint64 *)((long)local_198 + ((ulong)puStack_190 & 0xffffffff) * 2 * 8),0,
             (ulong)(uVar19 - (uint)puStack_190) << 4);
    }
    puStack_190 = (uint64 *)CONCAT44(puStack_190._4_4_,uVar19);
    lVar13 = 0;
    uVar28 = 0;
    do {
      this_01 = (elemental_vector *)((long)local_198 + lVar13);
      uVar12 = (local_188->m_alpha_selectors).m_size;
      uVar19 = *(uint *)((long)local_198 + lVar13 + 8);
      if (uVar19 != uVar12) {
        if (uVar19 <= uVar12) {
          if (*(uint *)((long)local_198 + lVar13 + 0xc) < uVar12) {
            elemental_vector::increase_capacity
                      (this_01,uVar12,uVar19 + 1 == uVar12,0x204,
                       vector<crnlib::alpha_selector_details>::object_mover,false);
            uVar19 = this_01->m_size;
          }
          if (uVar12 - uVar19 != 0) {
            uVar11 = (ulong)(uVar12 - uVar19) * 0x204 - 0x204;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar11;
            memset((void *)((ulong)uVar19 * 0x204 + (long)this_01->m_p),0,
                   (SUB168(auVar1 * ZEXT816(0xfe03f80fe03f80ff),8) & 0xfffffffffffffe00) +
                   (uVar11 / 0x204) * 4 + 0x204);
          }
        }
        this_01->m_size = uVar12;
      }
      auVar2 = local_198;
      this_02 = local_188->m_pTask_pool;
      pObj = (executable_task *)crnlib_malloc(0x28);
      pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ca9c0;
      pObj[1]._vptr_executable_task = (_func_int **)local_188;
      pObj[2]._vptr_executable_task = (_func_int **)create_alpha_selector_codebook_task;
      pObj[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
      bVar4 = task_pool::queue_task(this_02,pObj,uVar28,(void *)((long)auVar2 + lVar13));
      if (!bVar4) {
        crnlib_free(pObj);
      }
      uVar28 = uVar28 + 1;
      lVar13 = lVar13 + 0x10;
    } while (local_130 != uVar28);
  }
  pdVar3 = local_188;
  local_128 = this_00;
  task_pool::join(local_188->m_pTask_pool);
  auVar2 = local_198;
  uVar12 = (pdVar3->m_alpha_selectors).m_size;
  uVar11 = (ulong)uVar12;
  if (1 < local_17c) {
    uVar6 = 1;
    uVar14 = uVar11;
    do {
      iVar9 = (int)uVar11;
      uVar11 = 0;
      if (iVar9 != 0) {
        lVar13 = 0;
        uVar21 = 0;
        do {
          lVar22 = 0;
          lVar10 = lVar13;
          do {
            lVar24 = 8;
            lVar26 = lVar10;
            do {
              *(int *)(*(uint64 *)local_198 + lVar26) =
                   *(int *)(*(uint64 *)local_198 + lVar26) +
                   *(int *)(*(uint64 *)((long)local_198 + uVar6 * 2 * 8) + lVar26);
              lVar26 = lVar26 + 4;
              lVar24 = lVar24 + -1;
            } while (lVar24 != 0);
            lVar22 = lVar22 + 1;
            lVar10 = lVar10 + 0x20;
          } while (lVar22 != 0x10);
          lVar10 = uVar21 * 0x204;
          uVar25 = 1;
          if (*(char *)(*(uint64 *)local_198 + 0x200 + lVar10) == '\0') {
            uVar25 = *(undefined1 *)(*(uint64 *)((long)local_198 + uVar6 * 2 * 8) + 0x200 + lVar10);
          }
          *(undefined1 *)(*(uint64 *)local_198 + lVar10 + 0x200) = uVar25;
          uVar21 = uVar21 + 1;
          uVar11 = (ulong)(pdVar3->m_alpha_selectors).m_size;
          lVar13 = lVar13 + 0x204;
          uVar14 = uVar11;
        } while (uVar21 < uVar11);
      }
      uVar12 = (uint)uVar14;
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_130);
  }
  if (uVar12 != 0) {
    uVar14 = 0;
    uVar11 = 0;
    do {
      local_130 = uVar11;
      local_120->m_p[uVar14] = *(bool *)(*(uint64 *)local_198 + 0x200 + uVar14 * 0x204);
      lVar13 = *(uint64 *)local_198 + local_130;
      local_128->m_p[uVar14] = 0;
      lVar10 = 0;
      bVar7 = 0;
      do {
        lVar22 = lVar13 + lVar10;
        bVar4 = *(uint *)(lVar13 + 8 + lVar10) < *(uint *)(lVar13 + 4 + lVar10);
        bVar29 = *(uint *)(lVar13 + 0x10 + lVar10) < *(uint *)(lVar13 + 0xc + lVar10);
        bVar30 = *(uint *)(lVar13 + 0x18 + lVar10) < *(uint *)(lVar13 + 0x14 + lVar10);
        bVar31 = *(uint *)(lVar13 + 0x1c + lVar10) < *(uint *)(lVar13 + lVar10);
        uVar12 = 0;
        if (bVar31) {
          uVar12 = 7;
        }
        lVar26 = 0;
        if (bVar31) {
          lVar26 = 0x1c;
        }
        if (*(uint *)(lVar22 + 4 + (ulong)bVar4 * 4) < *(uint *)(lVar26 + lVar22)) {
          uVar12 = (uint)(byte)(bVar4 + 1);
        }
        if (*(uint *)(lVar22 + 0x14 + (ulong)bVar30 * 4) <
            *(uint *)(lVar22 + 0xc + (ulong)bVar29 * 4)) {
          bVar15 = bVar30 + 5;
        }
        else {
          bVar15 = bVar29 + 3;
        }
        uVar19 = (uint)bVar15;
        if (*(uint *)(lVar22 + (ulong)uVar12 * 4) <= *(uint *)(lVar22 + (ulong)(uint)bVar15 * 4)) {
          uVar19 = uVar12;
        }
        local_128->m_p[uVar14] = local_128->m_p[uVar14] | (ulong)uVar19 << (bVar7 & 0x3f);
        bVar7 = bVar7 + 3;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x200);
      uVar14 = uVar14 + 1;
      uVar11 = local_130 + 0x204;
    } while (uVar14 < (local_188->m_alpha_selectors).m_size);
  }
  if (local_198 != (undefined1  [8])0x0) {
    uVar11 = (ulong)puStack_190 & 0xffffffff;
    if (uVar11 != 0) {
      lVar13 = 0;
      do {
        if (*(void **)((long)auVar2 + lVar13) != (void *)0x0) {
          crnlib_free(*(void **)((long)auVar2 + lVar13));
        }
        lVar13 = lVar13 + 0x10;
      } while (uVar11 << 4 != lVar13);
    }
    crnlib_free((void *)local_198);
  }
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer(&local_d8);
  if (local_168.m_p != (uint *)0x0) {
    crnlib_free(local_168.m_p);
  }
  if (local_158.m_p != (vec<16U,_float> *)0x0) {
    crnlib_free(local_158.m_p);
  }
  if (local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.c.
                    super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.m_p != (void *)0x0) {
    crnlib_free(local_178.m_p);
  }
  if (local_148.m_p != (void *)0x0) {
    crnlib_free(local_148.m_p);
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<uint64> selectors(m_num_alpha_blocks * (m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks));
  for (uint i = 0, c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
    for (uint b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
      selectors[i++] = m_block_selectors[c][b];
  }

  crnlib::vector<SelectorNode> nodes;
  SelectorNode node(0, selectors.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<SelectorNode> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  float v[8];
  for (uint s = 0; s < 8; s++)
    v[s] = (s + 0.5f) * 0.125f;

  crnlib::vector<vec16F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(selectors.size());
  weights.reserve(selectors.size());
  for (uint64 prev_selector = 0; queue.size();) {
    SelectorNode node = queue.top();
    uint64 selector = *node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    uint weight = (uint16)selector;
    selector >>= 16;
    if (!vectors.size() || selector != prev_selector) {
      prev_selector = selector;
      vec16F vector;
      for (uint p = 0; p < 16; p++, selector >>= 3)
        vector[15 - p] = v[selector & 7];
      vectors.push_back(vector);
      weights.push_back(weight);
    } else if (weights.back() > UINT_MAX - weight) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += weight;
    }
  }

  tree_clusterizer<vec16F> selector_vq;
  selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_alpha_selector_codebook_size, false, m_pTask_pool);
  m_alpha_selectors.resize(selector_vq.get_codebook_size());
  m_alpha_selectors_used.resize(selector_vq.get_codebook_size());
  for (uint i = 0; i < selector_vq.get_codebook_size(); i++) {
    const vec16F& v = selector_vq.get_codebook_entry(i);
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, j = 0; j < 16; j++, sh += 3)
      m_alpha_selectors[i] |= (uint64)(v[j] * 8.0f) << sh;
  }

  crnlib::vector<crnlib::vector<alpha_selector_details> > selector_details(num_tasks);
  for (uint t = 0; t < num_tasks; t++) {
    selector_details[t].resize(m_alpha_selectors.size());
    m_pTask_pool->queue_object_task(this, &dxt_hc::create_alpha_selector_codebook_task, t, &selector_details[t]);
  }
  m_pTask_pool->join();

  for (uint t = 1; t < num_tasks; t++) {
    for (uint i = 0; i < m_alpha_selectors.size(); i++) {
      for (uint8 p = 0; p < 16; p++) {
        for (uint8 s = 0; s < 8; s++)
          selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
      }
      selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
    }
  }

  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    m_alpha_selectors_used[i] = selector_details[0][i].used;
    uint (&errors)[16][8] = selector_details[0][i].error;
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, p = 0; p < 16; p++, sh += 3) {
      uint* e = errors[p];
      uint8 s07 = e[7] < e[0] ? 7 : 0;
      uint8 s12 = e[2] < e[1] ? 2 : 1;
      uint8 s34 = e[4] < e[3] ? 4 : 3;
      uint8 s56 = e[6] < e[5] ? 6 : 5;
      uint8 s02 = e[s12] < e[s07] ? s12 : s07;
      uint8 s36 = e[s56] < e[s34] ? s56 : s34;
      m_alpha_selectors[i] |= (uint64)(e[s36] < e[s02] ? s36 : s02) << sh;
    }
  }
}